

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ut_set.hpp
# Opt level: O2

void __thiscall
cappuccino::ut_set<unsigned_long,_(cappuccino::thread_safe)1>::do_update
          (ut_set<unsigned_long,_(cappuccino::thread_safe)1> *this,keyed_iterator keyed_position,
          time_point expire_time)

{
  _Base_ptr p_Var1;
  uint in_EAX;
  _List_iterator<cappuccino::ut_set<unsigned_long,_(cappuccino::thread_safe)1>::ttl_element> _Var2;
  __off64_t *in_R8;
  size_t in_R9;
  list<cappuccino::ut_set<unsigned_long,_(cappuccino::thread_safe)1>::ttl_element,_std::allocator<cappuccino::ut_set<unsigned_long,_(cappuccino::thread_safe)1>::ttl_element>_>
  *__x;
  
  p_Var1 = keyed_position._M_node[1]._M_parent;
  p_Var1->_M_left = (_Base_ptr)expire_time.__d.__r;
  __x = &this->m_ttl_list;
  std::__cxx11::
  list<cappuccino::ut_set<unsigned_long,_(cappuccino::thread_safe)1>::ttl_element,_std::allocator<cappuccino::ut_set<unsigned_long,_(cappuccino::thread_safe)1>::ttl_element>_>
  ::splice(__x,(int)__x,(__off64_t *)__x,(int)p_Var1,in_R8,in_R9,in_EAX);
  _Var2 = std::
          prev<std::_List_iterator<cappuccino::ut_set<unsigned_long,(cappuccino::thread_safe)1>::ttl_element>>
                    ((_List_iterator<cappuccino::ut_set<unsigned_long,_(cappuccino::thread_safe)1>::ttl_element>
                      )__x,1);
  keyed_position._M_node[1]._M_parent = (_Base_ptr)_Var2._M_node;
  return;
}

Assistant:

auto do_update(keyed_iterator keyed_position, std::chrono::steady_clock::time_point expire_time) -> void
    {
        auto& element = keyed_position->second;

        // Update the ttl_element's expire time.
        element.m_ttl_position->m_expire_time = expire_time;

        // Push to the end of the Ttl list.
        m_ttl_list.splice(m_ttl_list.end(), m_ttl_list, element.m_ttl_position);

        // Update the elements iterator to ttl_element.
        element.m_ttl_position = std::prev(m_ttl_list.end());
    }